

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

CryptoUtil * __thiscall
cfd::core::CryptoUtil::DecryptAes256CbcToString_abi_cxx11_
          (CryptoUtil *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *iv,ByteData *data)

{
  uchar *puVar1;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  ByteData local_70;
  ByteData local_58;
  undefined1 local_40 [8];
  ByteData decrypt_data;
  ByteData *data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *iv_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  string *decrypt_string;
  
  decrypt_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  ByteData::ByteData(&local_58,key);
  ByteData::ByteData(&local_70,iv);
  DecryptAes256Cbc((ByteData *)local_40,&local_58,&local_70,
                   (ByteData *)
                   decrypt_data.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData(&local_70);
  ByteData::~ByteData(&local_58);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
                     (ByteData *)local_40);
  ::std::__cxx11::string::string((string *)this);
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  ::std::__cxx11::string::append((char *)this,(ulong)puVar1);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  ByteData::~ByteData((ByteData *)local_40);
  return this;
}

Assistant:

std::string CryptoUtil::DecryptAes256CbcToString(
    const std::vector<uint8_t> &key, const std::vector<uint8_t> &iv,
    const ByteData &data) {
  ByteData decrypt_data = DecryptAes256Cbc(ByteData(key), ByteData(iv), data);
  std::vector<uint8_t> output = decrypt_data.GetBytes();
  std::string decrypt_string;
  decrypt_string.append(
      reinterpret_cast<const char *>(output.data()), output.size());
  return decrypt_string;
}